

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUniversalConstraint.cpp
# Opt level: O3

void __thiscall
btUniversalConstraint::btUniversalConstraint
          (btUniversalConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *anchor,
          btVector3 *axis1,btVector3 *axis2)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  btTranslationalLimitMotor *pbVar6;
  btTransform *frameInA;
  btTransform *frameInB;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btVector3 local_78;
  float local_68;
  float local_64;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_48;
  float local_40;
  
  frameInA = btTransform::getIdentity();
  frameInB = btTransform::getIdentity();
  btGeneric6DofConstraint::btGeneric6DofConstraint
            (&this->super_btGeneric6DofConstraint,rbA,rbB,frameInA,frameInB,true);
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00220738;
  uVar3 = *(undefined8 *)(anchor->m_floats + 2);
  *(undefined8 *)(this->m_anchor).m_floats = *(undefined8 *)anchor->m_floats;
  *(undefined8 *)((this->m_anchor).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(axis1->m_floats + 2);
  *(undefined8 *)(this->m_axis1).m_floats = *(undefined8 *)axis1->m_floats;
  *(undefined8 *)((this->m_axis1).m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)(axis2->m_floats + 2);
  *(undefined8 *)(this->m_axis2).m_floats = *(undefined8 *)axis2->m_floats;
  *(undefined8 *)((this->m_axis2).m_floats + 2) = uVar3;
  fVar12 = (this->m_axis1).m_floats[2];
  uVar3 = *(undefined8 *)(this->m_axis1).m_floats;
  fVar10 = (float)uVar3;
  fVar15 = (float)((ulong)uVar3 >> 0x20);
  fVar9 = 1.0 / SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar15 * fVar15);
  fVar12 = fVar12 * fVar9;
  fVar10 = fVar9 * fVar10;
  fVar9 = fVar9 * fVar15;
  *(ulong *)(this->m_axis1).m_floats = CONCAT44(fVar9,fVar10);
  (this->m_axis1).m_floats[2] = fVar12;
  fVar15 = (this->m_axis2).m_floats[2];
  uVar3 = *(undefined8 *)(this->m_axis2).m_floats;
  fVar14 = (float)uVar3;
  fVar8 = (float)((ulong)uVar3 >> 0x20);
  fVar13 = 1.0 / SQRT(fVar15 * fVar15 + fVar14 * fVar14 + fVar8 * fVar8);
  fVar15 = fVar15 * fVar13;
  fVar14 = fVar13 * fVar14;
  fVar13 = fVar13 * fVar8;
  *(ulong *)(this->m_axis2).m_floats = CONCAT44(fVar13,fVar14);
  (this->m_axis2).m_floats[2] = fVar15;
  fVar11 = fVar13 * fVar12 - fVar9 * fVar15;
  fVar16 = fVar15 * fVar10 - fVar12 * fVar14;
  fVar7 = fVar14 * fVar9 - fVar10 * fVar13;
  fVar8 = anchor->m_floats[0];
  fVar1 = anchor->m_floats[1];
  fVar2 = anchor->m_floats[2];
  btTransform::inverse(&(rbA->super_btCollisionObject).m_worldTransform);
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats =
       CONCAT44(local_78.m_floats[2] * fVar15 +
                local_78.m_floats[0] * fVar14 + local_78.m_floats[1] * fVar13,
                local_78.m_floats[2] * fVar7 +
                local_78.m_floats[0] * fVar11 + local_78.m_floats[1] * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats[2] =
       fVar12 * local_78.m_floats[2] + fVar10 * local_78.m_floats[0] + fVar9 * local_78.m_floats[1];
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats =
       CONCAT44(local_60 * fVar15 + local_68 * fVar14 + local_64 * fVar13,
                local_60 * fVar7 + local_68 * fVar11 + local_64 * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats[2] =
       fVar12 * local_60 + fVar10 * local_68 + fVar9 * local_64;
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats =
       CONCAT44(local_50 * fVar15 + local_58 * fVar14 + local_54 * fVar13,
                local_50 * fVar7 + local_58 * fVar11 + local_54 * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats[2] =
       fVar12 * local_50 + fVar10 * local_58 + fVar9 * local_54;
  (this->super_btGeneric6DofConstraint).m_frameInA.m_basis.m_el[2].m_floats[3] = 0.0;
  auVar5._4_4_ = (float)((ulong)local_48 >> 0x20) +
                 local_60 * fVar2 + local_68 * fVar8 + local_64 * fVar1;
  auVar5._0_4_ = (float)local_48 +
                 local_78.m_floats[2] * fVar2 +
                 local_78.m_floats[0] * fVar8 + local_78.m_floats[1] * fVar1;
  auVar5._8_4_ = fVar2 * local_50 + fVar8 * local_58 + fVar1 * local_54 + local_40;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_btGeneric6DofConstraint).m_frameInA.m_origin.m_floats = auVar5;
  btTransform::inverse(&(rbB->super_btCollisionObject).m_worldTransform);
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats =
       CONCAT44(local_78.m_floats[2] * fVar15 +
                local_78.m_floats[0] * fVar14 + local_78.m_floats[1] * fVar13,
                local_78.m_floats[2] * fVar7 +
                local_78.m_floats[0] * fVar11 + local_78.m_floats[1] * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats[2] =
       fVar12 * local_78.m_floats[2] + fVar10 * local_78.m_floats[0] + fVar9 * local_78.m_floats[1];
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats =
       CONCAT44(local_60 * fVar15 + local_68 * fVar14 + local_64 * fVar13,
                local_60 * fVar7 + local_68 * fVar11 + local_64 * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats[2] =
       fVar12 * local_60 + fVar10 * local_68 + fVar9 * local_64;
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[1].m_floats[3] = 0.0;
  *(ulong *)(this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats =
       CONCAT44(local_50 * fVar15 + local_58 * fVar14 + local_54 * fVar13,
                local_50 * fVar7 + local_58 * fVar11 + local_54 * fVar16);
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats[2] =
       fVar12 * local_50 + fVar10 * local_58 + fVar9 * local_54;
  (this->super_btGeneric6DofConstraint).m_frameInB.m_basis.m_el[2].m_floats[3] = 0.0;
  auVar4._4_4_ = (float)((ulong)local_48 >> 0x20) +
                 local_60 * fVar2 + local_68 * fVar8 + local_64 * fVar1;
  auVar4._0_4_ = (float)local_48 +
                 local_78.m_floats[2] * fVar2 +
                 local_78.m_floats[0] * fVar8 + local_78.m_floats[1] * fVar1;
  auVar4._8_4_ = fVar2 * local_50 + fVar8 * local_58 + fVar1 * local_54 + local_40;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->super_btGeneric6DofConstraint).m_frameInB.m_origin.m_floats = auVar4;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_upperLimit.m_floats[0] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_upperLimit.m_floats[1] = 0.0;
  pbVar6 = &(this->super_btGeneric6DofConstraint).m_linearLimits;
  (pbVar6->m_upperLimit).m_floats[2] = 0.0;
  (pbVar6->m_upperLimit).m_floats[3] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_lowerLimit.m_floats[0] = 0.0;
  (this->super_btGeneric6DofConstraint).m_linearLimits.m_lowerLimit.m_floats[1] = 0.0;
  pbVar6 = &(this->super_btGeneric6DofConstraint).m_linearLimits;
  (pbVar6->m_lowerLimit).m_floats[2] = 0.0;
  (pbVar6->m_lowerLimit).m_floats[3] = 0.0;
  local_78.m_floats[0] = 0.0;
  local_78.m_floats[1] = -1.5607964;
  local_78.m_floats[2] = -3.1315928;
  local_78.m_floats[3] = 0.0;
  btGeneric6DofConstraint::setAngularLowerLimit(&this->super_btGeneric6DofConstraint,&local_78);
  local_78.m_floats[0] = 0.0;
  local_78.m_floats[1] = 1.5607964;
  local_78.m_floats[2] = 3.1315928;
  local_78.m_floats[3] = 0.0;
  btGeneric6DofConstraint::setAngularUpperLimit(&this->super_btGeneric6DofConstraint,&local_78);
  return;
}

Assistant:

btUniversalConstraint::btUniversalConstraint(btRigidBody& rbA, btRigidBody& rbB, const btVector3& anchor, const btVector3& axis1, const btVector3& axis2)
: btGeneric6DofConstraint(rbA, rbB, btTransform::getIdentity(), btTransform::getIdentity(), true),
 m_anchor(anchor),
 m_axis1(axis1),
 m_axis2(axis2)
{
	// build frame basis
	// 6DOF constraint uses Euler angles and to define limits
	// it is assumed that rotational order is :
	// Z - first, allowed limits are (-PI,PI);
	// new position of Y - second (allowed limits are (-PI/2 + epsilon, PI/2 - epsilon), where epsilon is a small positive number 
	// used to prevent constraint from instability on poles;
	// new position of X, allowed limits are (-PI,PI);
	// So to simulate ODE Universal joint we should use parent axis as Z, child axis as Y and limit all other DOFs
	// Build the frame in world coordinate system first
	btVector3 zAxis = m_axis1.normalize();
	btVector3 yAxis = m_axis2.normalize();
	btVector3 xAxis = yAxis.cross(zAxis); // we want right coordinate system
	btTransform frameInW;
	frameInW.setIdentity();
	frameInW.getBasis().setValue(	xAxis[0], yAxis[0], zAxis[0],	
									xAxis[1], yAxis[1], zAxis[1],
									xAxis[2], yAxis[2], zAxis[2]);
	frameInW.setOrigin(anchor);
	// now get constraint frame in local coordinate systems
	m_frameInA = rbA.getCenterOfMassTransform().inverse() * frameInW;
	m_frameInB = rbB.getCenterOfMassTransform().inverse() * frameInW;
	// sei limits
	setLinearLowerLimit(btVector3(0., 0., 0.));
	setLinearUpperLimit(btVector3(0., 0., 0.));
	setAngularLowerLimit(btVector3(0.f, -SIMD_HALF_PI + UNIV_EPS, -SIMD_PI + UNIV_EPS));
	setAngularUpperLimit(btVector3(0.f,  SIMD_HALF_PI - UNIV_EPS,  SIMD_PI - UNIV_EPS));
}